

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  bool bVar1;
  undefined8 *puVar2;
  uint64_t *puVar3;
  int64_t *piVar4;
  int64_t *piVar5;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  hugeint_t hVar6;
  hugeint_t rentry_2;
  hugeint_t lentry_2;
  idx_t i;
  hugeint_t rentry_1;
  hugeint_t lentry_1;
  idx_t start;
  hugeint_t rentry;
  hugeint_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffea0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffea8;
  ValidityMask *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec7;
  uint64_t in_stack_fffffffffffffec8;
  int64_t in_stack_fffffffffffffed0;
  uint64_t in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  ulong local_110;
  idx_t in_stack_ffffffffffffff00;
  uint64_t local_e8;
  uint64_t local_e0;
  idx_t local_b8;
  unsigned_long local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  hugeint_t local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 0x10),in_RDX,
             (void *)((long)in_RDX + in_RCX * 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_10,(void *)((long)local_10 + local_20 * 0x10),local_18,
             (void *)((long)local_18 + local_20 * 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (local_110 = 0; local_110 < local_20; local_110 = local_110 + 1) {
      piVar4 = (int64_t *)((long)local_8 + local_110 * 0x10);
      piVar5 = (int64_t *)((long)local_10 + local_110 * 0x10);
      left_01.upper = *piVar4;
      left_01.lower = piVar5[1];
      hVar6.upper = *piVar5;
      hVar6.lower = in_stack_fffffffffffffec8;
      hVar6 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::BitwiseXOROperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                        ((bool)in_stack_fffffffffffffec7,left_01,hVar6,(ValidityMask *)piVar4[1],
                         in_stack_ffffffffffffff00);
      in_stack_fffffffffffffec7 = hVar6.lower._7_1_;
      in_stack_fffffffffffffec8 = hVar6.upper;
      puVar3 = (uint64_t *)((long)local_18 + local_110 * 0x10);
      *puVar3 = hVar6.lower;
      puVar3[1] = in_stack_fffffffffffffec8;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0xe62ea9);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          puVar2 = (undefined8 *)((long)local_8 + local_38 * 0x10);
          local_98 = *puVar2;
          local_90 = puVar2[1];
          puVar2 = (undefined8 *)((long)local_10 + local_38 * 0x10);
          local_a8 = *puVar2;
          local_a0 = puVar2[1];
          left.upper = in_stack_fffffffffffffee0;
          left.lower = in_stack_fffffffffffffed8;
          right.upper = in_stack_fffffffffffffed0;
          right.lower = in_stack_fffffffffffffec8;
          local_78 = local_a8;
          local_70 = local_a0;
          local_68 = local_98;
          local_60 = local_90;
          local_88 = BinaryStandardOperatorWrapper::
                     Operation<bool,duckdb::BitwiseXOROperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                               ((bool)in_stack_fffffffffffffec7,left,right,in_stack_fffffffffffffeb8
                                ,in_stack_ffffffffffffff00);
          puVar3 = (uint64_t *)((long)local_18 + local_38 * 0x10);
          *puVar3 = local_88.lower;
          puVar3[1] = local_88.upper;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_b0 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_b8 = local_38 - local_b0;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_b8);
            if (bVar1) {
              in_stack_ffffffffffffff00 = *(idx_t *)((long)local_10 + local_38 * 0x10 + 8);
              left_00.upper = in_stack_fffffffffffffee0;
              left_00.lower = in_stack_fffffffffffffed8;
              right_00.upper = in_stack_fffffffffffffed0;
              right_00.lower = in_stack_fffffffffffffec8;
              hVar6 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::BitwiseXOROperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                ((bool)in_stack_fffffffffffffec7,left_00,right_00,
                                 in_stack_fffffffffffffeb8,in_stack_ffffffffffffff00);
              puVar3 = (uint64_t *)((long)local_18 + local_38 * 0x10);
              local_e8 = hVar6.lower;
              *puVar3 = local_e8;
              local_e0 = hVar6.upper;
              puVar3[1] = local_e0;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}